

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

bool __thiscall fasttext::Dictionary::readWord(Dictionary *this,istream *in,string *word)

{
  byte bVar1;
  
  word->_M_string_length = 0;
  *(word->_M_dataplus)._M_p = '\0';
  while( true ) {
    while( true ) {
      bVar1 = std::streambuf::sbumpc();
      if (bVar1 == 0xff) {
        std::istream::get();
        return word->_M_string_length != 0;
      }
      if (((((bVar1 & 0xfb) == 9) || (bVar1 == 0)) || (bVar1 == 10)) ||
         (((bVar1 == 0xb || (bVar1 == 0x20)) || (bVar1 == 0xc)))) break;
      std::__cxx11::string::push_back((char)word);
    }
    if (word->_M_string_length != 0) break;
    if (bVar1 == 10) {
      std::__cxx11::string::append((string *)word);
      return true;
    }
  }
  if (bVar1 != 10) {
    return true;
  }
  std::streambuf::sungetc();
  return true;
}

Assistant:

bool Dictionary::readWord(std::istream& in, std::string& word) const
{
  char c;
  std::streambuf& sb = *in.rdbuf();
  word.clear();
  while ((c = sb.sbumpc()) != EOF) {
    if (c == ' ' || c == '\n' || c == '\r' || c == '\t' || c == '\v' || c == '\f' || c == '\0') {
      if (word.empty()) {
        if (c == '\n') {
          word += EOS;
          return true;
        }
        continue;
      } else {
        if (c == '\n')
          sb.sungetc();
        return true;
      }
    }
    word.push_back(c);
  }
  // trigger eofbit
  in.get();
  return !word.empty();
}